

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cave-map.c
# Opt level: O0

void cave_known(player *p)

{
  _Bool _Var1;
  loc_conflict grid_00;
  loc_conflict grid_01;
  square_conflict *psVar2;
  loc adj_grid;
  wchar_t count;
  wchar_t d;
  loc grid;
  wchar_t x;
  wchar_t y;
  player *p_local;
  
  for (grid.y = 0; grid.y < cave->height; grid.y = grid.y + 1) {
    for (grid.x = 0; grid.x < cave->width; grid.x = grid.x + 1) {
      grid_00 = (loc_conflict)loc(grid.x,grid.y);
      adj_grid.x = 0;
      for (adj_grid.y = 0; adj_grid.y < 8; adj_grid.y = adj_grid.y + 1) {
        grid_01 = (loc_conflict)loc_sum((loc)grid_00,ddgrid_ddd[adj_grid.y]);
        _Var1 = square_isprojectable((chunk *)cave,grid_01);
        if ((!_Var1) || (_Var1 = square_isbright((chunk *)cave,grid_01), _Var1)) {
          adj_grid.x = adj_grid.x + 1;
        }
      }
      if (adj_grid.x < 8) {
        psVar2 = square((chunk *)cave,grid_00);
        p->cave->squares[grid.y][grid.x].feat = psVar2->feat;
      }
    }
  }
  return;
}

Assistant:

void cave_known(struct player *p)
{
	int y, x;
	for (y = 0; y < cave->height; y++) {
		for (x = 0; x < cave->width; x++) {
			struct loc grid = loc(x, y);
			int d;
			int count = 0;

			/* Check around the grid */
			for (d = 0; d < 8; d++) {
				/* Extract adjacent location */
				struct loc adj_grid = loc_sum(grid, ddgrid_ddd[d]);

				/* Don't count projectable or lava squares */
				if (!square_isprojectable(cave, adj_grid) ||
					square_isbright(cave, adj_grid))
					++count;
			}

			/* Internal walls not known */
			if (count < 8) {
				p->cave->squares[y][x].feat = square(cave, grid)->feat;
			}
		}
	}
}